

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O3

REF_STATUS ref_list_delete(REF_LIST ref_list,REF_INT item)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_STATUS RVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = ref_list->n;
  if (iVar5 < 1) {
    iVar4 = 0;
  }
  else {
    pRVar2 = ref_list->value;
    lVar6 = 0;
    iVar4 = 0;
    do {
      iVar1 = pRVar2[lVar6];
      if (iVar1 != item) {
        pRVar2[iVar4] = iVar1;
        iVar4 = iVar4 + 1;
        iVar5 = ref_list->n;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  RVar3 = 5;
  if (iVar4 != iVar5) {
    ref_list->n = iVar4;
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_list_delete(REF_LIST ref_list, REF_INT item) {
  REF_INT to, from;

  to = 0;
  for (from = 0; from < ref_list_n(ref_list); from++) {
    if (item != ref_list->value[from]) {
      ref_list->value[to] = ref_list->value[from];
      to++;
    }
  }

  if (to == ref_list_n(ref_list)) return REF_NOT_FOUND;

  ref_list_n(ref_list) = to;

  return REF_SUCCESS;
}